

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InvokeBusyHandler(BusyHandler *p)

{
  int rc;
  BusyHandler *p_local;
  
  if ((p->xBusyHandler == (_func_int_void_ptr_int *)0x0) || (p->nBusy < 0)) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = (*p->xBusyHandler)(p->pBusyArg,p->nBusy);
    if (p_local._4_4_ == 0) {
      p->nBusy = -1;
    }
    else {
      p->nBusy = p->nBusy + 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3InvokeBusyHandler(BusyHandler *p){
  int rc;
  if( p->xBusyHandler==0 || p->nBusy<0 ) return 0;
  rc = p->xBusyHandler(p->pBusyArg, p->nBusy);
  if( rc==0 ){
    p->nBusy = -1;
  }else{
    p->nBusy++;
  }
  return rc;
}